

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  char *__s;
  byte bVar2;
  byte bVar3;
  char cVar4;
  CURLcode CVar5;
  CURLUcode CVar6;
  size_t sVar7;
  Curl_handler *pCVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  size_t buflen;
  size_t sVar16;
  dynbuf *mem;
  uchar *i;
  bool bVar17;
  char *decoded;
  char *oldurl;
  char *redired_url;
  uint local_98;
  CURLU *local_90;
  char *local_80;
  uint local_74;
  dynbuf local_70;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u->field_0x52 = u->field_0x52 & 0xfe;
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u->field_0x52 = u->field_0x52 & 0xfd;
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto switchD_00162140_default;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar7 = strlen(part);
  if (8000000 < sVar7) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
switchD_00162140_default:
    return CURLUE_UNKNOWN_PART;
  }
  bVar2 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    if (sVar7 == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar16 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar16 != 0) ||
       (CVar6 = curl_url_get(u,CURLUPART_URL,&local_70.bufr,flags), CVar6 != CURLUE_OK)) {
      CVar6 = parseurl_and_replace(part,u,flags);
      return CVar6;
    }
    CVar5 = concat_url(local_70.bufr,part,&local_50.bufr);
    (*Curl_cfree)(local_70.bufr);
    if (CVar5 == CURLE_OK) {
      pcVar12 = (char *)CONCAT53(local_50.bufr._3_5_,
                                 CONCAT12(local_50.bufr._2_1_,
                                          CONCAT11(local_50.bufr._1_1_,local_50.bufr._0_1_)));
      CVar6 = parseurl_and_replace(pcVar12,u,flags);
      (*Curl_cfree)(pcVar12);
      return CVar6;
    }
    goto LAB_0016252e;
  case CURLUPART_SCHEME:
    if (sVar7 - 0x29 < 0xffffffffffffffd8) {
      return CURLUE_BAD_SCHEME;
    }
    if (((flags & 8) == 0) &&
       (pCVar8 = Curl_get_scheme_handler(part), pCVar8 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    if (0x19 < (byte)((*part & 0xdfU) + 0xbf)) {
      return CURLUE_BAD_SCHEME;
    }
    if (sVar7 != 1) {
      lVar11 = 0;
      do {
        bVar2 = part[lVar11];
        if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
          if (0x2e < bVar2) {
            return CURLUE_BAD_SCHEME;
          }
          if ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
            return CURLUE_BAD_SCHEME;
          }
        }
        lVar11 = lVar11 + 1;
      } while (sVar7 - 1 != lVar11);
    }
    u->field_0x52 = u->field_0x52 & 0xfb;
    bVar17 = true;
    local_98 = 0;
    uVar13 = 0;
    bVar2 = 0;
    local_90 = u;
    goto LAB_001623c1;
  case CURLUPART_USER:
    local_90 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_90 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_90 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_90 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    piVar9 = __errno_location();
    *piVar9 = 0;
    uVar10 = strtoul(part,&local_70.bufr,10);
    if (0xffff < uVar10 || *piVar9 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_70.bufr != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar12 = (*Curl_cstrdup)(part);
    if (pcVar12 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar12;
    u->portnum = (unsigned_short)uVar10;
    return CURLUE_OK;
  case CURLUPART_PATH:
    local_90 = (CURLU *)&u->path;
    uVar13 = 0x17ab01;
    local_98 = 0;
    bVar17 = true;
    goto LAB_001623c1;
  case CURLUPART_QUERY:
    bVar17 = -1 < (char)(byte)flags;
    local_98 = flags >> 8;
    local_90 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_001623bf;
  case CURLUPART_FRAGMENT:
    u->field_0x52 = u->field_0x52 | 2;
    local_90 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_90 = (CURLU *)&u->zoneid;
  }
  bVar17 = true;
  local_98 = 0;
LAB_001623bf:
  uVar13 = 0;
LAB_001623c1:
  local_74 = uVar13;
  Curl_dyn_init(&local_70,(ulong)(uVar13 & 0xff) + sVar7 * 3 + 1);
  if (((char)uVar13 != '\0') && (*part != '/')) {
    CVar5 = Curl_dyn_addn(&local_70,"/",1);
    CVar6 = CURLUE_OUT_OF_MEMORY;
    if (CVar5 == CURLE_TOO_LARGE) {
      CVar6 = CURLUE_TOO_LARGE;
    }
    if (CVar5 != CURLE_OK) {
      return CVar6;
    }
  }
  if (bVar2 == 0) {
    CVar5 = Curl_dyn_add(&local_70,part);
    if (CVar5 == CURLE_OK) {
      pcVar12 = Curl_dyn_ptr(&local_70);
      do {
        lVar11 = 1;
        if (*pcVar12 == '%') {
          bVar3 = pcVar12[1];
          if (((((byte)(bVar3 - 0x30) < 10) ||
               ((bVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar1 = pcVar12[2], (byte)(bVar1 - 0x30) < 10 ||
                        ((bVar1 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar3 + 0xbf) < 0x1a || (byte)(bVar1 + 0xbf) < 0x1a)) {
            cVar4 = Curl_raw_tolower(bVar3);
            pcVar12[1] = cVar4;
            cVar4 = Curl_raw_tolower(pcVar12[2]);
            pcVar12[2] = cVar4;
            lVar11 = 3;
          }
        }
        else if (*pcVar12 == '\0') goto LAB_001625e8;
        pcVar12 = pcVar12 + lVar11;
      } while( true );
    }
LAB_0016252e:
    if (CVar5 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  bVar3 = *part;
  if (bVar3 != 0) {
    uVar13 = local_98;
    do {
      if ((bool)(bVar3 != 0x20 | bVar17)) {
        if (((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
LAB_001624a1:
          uVar15 = uVar13 & 0xff;
          uVar14 = uVar15;
          if ((uVar13 & 1) != 0) {
            uVar14 = 0;
          }
          uVar13 = uVar14;
          if (bVar3 != 0x3d) {
            uVar13 = uVar15;
          }
          sVar16 = 1;
          mem = (dynbuf *)part;
        }
        else {
          uVar14 = (uint)bVar3;
          if (bVar3 < 0x3d) {
            if ((1 < bVar3 - 0x2d) && ((bVar3 != 0x2f || ((char)local_74 == '\0'))))
            goto LAB_001624e9;
            goto LAB_001624a1;
          }
          if (bVar3 == 0x3d) {
            if ((uVar13 & 1) != 0) goto LAB_001624a1;
          }
          else if ((uVar14 == 0x5f) || (uVar14 == 0x7e)) goto LAB_001624a1;
LAB_001624e9:
          local_50.bufr._0_1_ = 0x25;
          local_50.bufr._1_1_ = "0123456789abcdef"[bVar3 >> 4];
          local_50.bufr._2_1_ = "0123456789abcdef"[uVar14 & 0xf];
          sVar16 = 3;
          mem = &local_50;
        }
        CVar5 = Curl_dyn_addn(&local_70,mem,sVar16);
        if (CVar5 != CURLE_OK) goto LAB_0016252e;
      }
      else {
        CVar5 = Curl_dyn_addn(&local_70,"+",1);
        if (CVar5 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      bVar3 = *(byte *)((long)&((dynbuf *)part)->bufr + 1);
      part = (char *)((long)&((dynbuf *)part)->bufr + 1);
    } while (bVar3 != 0);
  }
LAB_001625e8:
  pcVar12 = Curl_dyn_ptr(&local_70);
  if (((byte)local_98 & pcVar12 != (char *)0x0) == 1) {
    __s = u->query;
    if ((__s != (char *)0x0) && (sVar7 = strlen(__s), sVar7 != 0)) {
      cVar4 = __s[sVar7 - 1];
      Curl_dyn_init(&local_50,8000000);
      CVar5 = Curl_dyn_addn(&local_50,u->query,sVar7);
      if ((CVar5 == CURLE_OK) &&
         (((cVar4 == '&' || (CVar5 = Curl_dyn_addn(&local_50,"&",1), CVar5 == CURLE_OK)) &&
          (CVar5 = Curl_dyn_add(&local_50,pcVar12), CVar5 == CURLE_OK)))) {
        Curl_dyn_free(&local_70);
        (*Curl_cfree)(local_90->scheme);
        pcVar12 = Curl_dyn_ptr(&local_50);
        local_90->scheme = pcVar12;
        return CURLUE_OK;
      }
      Curl_dyn_free(&local_70);
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  else if ((what == CURLUPART_HOST) &&
          (sVar16 = Curl_dyn_len(&local_70), ((byte)(flags >> 10) & sVar16 == 0) == 0)) {
    if (sVar16 == 0) {
LAB_00162761:
      Curl_dyn_free(&local_70);
      return CURLUE_BAD_HOSTNAME;
    }
    if (bVar2 == 0) {
      local_80 = (char *)0x0;
      CVar5 = Curl_urldecode(pcVar12,sVar16,&local_80,(size_t *)&local_50,REJECT_CTRL);
      if ((CVar5 != CURLE_OK) ||
         (CVar6 = hostname_check(u,local_80,
                                 CONCAT53(local_50.bufr._3_5_,
                                          CONCAT12(local_50.bufr._2_1_,
                                                   CONCAT11(local_50.bufr._1_1_,local_50.bufr._0_1_)
                                                  ))), CVar6 != CURLUE_OK)) {
        (*Curl_cfree)(local_80);
        goto LAB_00162761;
      }
      (*Curl_cfree)(local_80);
    }
    else {
      CVar6 = hostname_check(u,pcVar12,sVar16);
      if (CVar6 != CURLUE_OK) goto LAB_00162761;
    }
  }
  (*Curl_cfree)(local_90->scheme);
  local_90->scheme = pcVar12;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      char *endp;
      unsigned long port;
      errno = 0;
      port = strtoul(part, &endp, 10);  /* must be decimal */
      if(errno || (port > 0xffff) || *endp)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = strdup(part);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLcode result;
    CURLUcode uc;
    char *oldurl;
    char *redired_url;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute URL in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    result = concat_url(oldurl, part, &redired_url);
    free(oldurl);
    if(result)
      return cc2cu(result);

    uc = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          char out[3]={'%'};
          out[1] = hexdigits[*i>>4];
          out[2] = hexdigits[*i & 0xf];
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)newp, n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  return CURLUE_OK;
}